

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  anon_class_16_2_37b75eea *__f;
  thread *in_RDI;
  __sighandler_t previousSignalHandler;
  time_point start;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  function<void_()> *in_stack_fffffffffffffe30;
  type *in_stack_fffffffffffffe38;
  thread *this_00;
  Args *in_stack_fffffffffffffe58;
  Args *in_stack_fffffffffffffe60;
  
  std::chrono::_V2::steady_clock::now();
  this_00 = in_RDI;
  Args::Args(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::thread::thread<fasttext::Autotune::startTimer(fasttext::Args_const&)::__1,,void>
            (this_00,in_stack_fffffffffffffe38);
  std::thread::operator=
            (in_RDI,(thread *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  std::thread::~thread((thread *)0x19ab84);
  startTimer(fasttext::Args_const&)::$_1::~__1((type *)0x19ab8e);
  in_RDI[3]._M_id._M_thread = 0xbff0000000000000;
  *(undefined4 *)&in_RDI[4]._M_id._M_thread = 0;
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_fffffffffffffe0f);
  __f = (anon_class_16_2_37b75eea *)signal(2,anon_unknown.dwarf_1aac4::signalHandler);
  std::function<void()>::operator=(in_stack_fffffffffffffe30,__f);
  return;
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}